

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidload.c
# Opt level: O0

void cid_parse_font_matrix(CID_Face face,CID_Parser *parser)

{
  uint uVar1;
  CID_FaceDict pCVar2;
  FT_Bool FVar3;
  FT_Int FVar4;
  FT_Long FVar5;
  bool bVar6;
  long local_80;
  FT_Int result;
  FT_Vector *offset;
  FT_Matrix *matrix;
  FT_Fixed temp_scale;
  FT_Fixed temp [6];
  FT_Face root;
  CID_FaceDict dict;
  CID_Parser *parser_local;
  CID_Face face_local;
  
  if (parser->num_dict < (face->cid).num_dicts) {
    pCVar2 = (face->cid).font_dicts;
    uVar1 = parser->num_dict;
    temp[5] = (FT_Fixed)face;
    FVar4 = (*(parser->root).funcs.to_fixed_array)(&parser->root,6,&temp_scale,3);
    if (5 < FVar4) {
      if (temp[2] < 0) {
        local_80 = -temp[2];
      }
      else {
        local_80 = temp[2];
      }
      if (local_80 != 0) {
        if (local_80 != 0x10000) {
          FVar5 = FT_DivFix(1000,local_80);
          *(short *)(temp[5] + 0x88) = (short)FVar5;
          temp_scale = FT_DivFix(temp_scale,local_80);
          temp[0] = FT_DivFix(temp[0],local_80);
          temp[1] = FT_DivFix(temp[1],local_80);
          temp[3] = FT_DivFix(temp[3],local_80);
          temp[4] = FT_DivFix(temp[4],local_80);
          bVar6 = temp[2] < 0;
          temp[2] = 0x10000;
          if (bVar6) {
            temp[2] = -0x10000;
          }
        }
        pCVar2[uVar1].font_matrix.xx = temp_scale;
        pCVar2[uVar1].font_matrix.yx = temp[0];
        pCVar2[uVar1].font_matrix.xy = temp[1];
        pCVar2[uVar1].font_matrix.yy = temp[2];
        FVar3 = FT_Matrix_Check(&pCVar2[uVar1].font_matrix);
        if (FVar3 == '\0') {
          (parser->root).error = 3;
        }
        else {
          pCVar2[uVar1].font_offset.x = temp[3] >> 0x10;
          pCVar2[uVar1].font_offset.y = temp[4] >> 0x10;
        }
      }
    }
  }
  return;
}

Assistant:

FT_CALLBACK_DEF( void )
  cid_parse_font_matrix( CID_Face     face,
                         CID_Parser*  parser )
  {
    CID_FaceDict  dict;
    FT_Face       root = (FT_Face)&face->root;
    FT_Fixed      temp[6];
    FT_Fixed      temp_scale;


    if ( parser->num_dict < face->cid.num_dicts )
    {
      FT_Matrix*  matrix;
      FT_Vector*  offset;
      FT_Int      result;


      dict   = face->cid.font_dicts + parser->num_dict;
      matrix = &dict->font_matrix;
      offset = &dict->font_offset;

      /* input is scaled by 1000 to accommodate default FontMatrix */
      result = cid_parser_to_fixed_array( parser, 6, temp, 3 );

      if ( result < 6 )
      {
        FT_ERROR(( "cid_parse_font_matrix: not enough matrix elements\n" ));
        goto Exit;
      }

      FT_TRACE4(( " [%f %f %f %f %f %f]\n",
                  (double)temp[0] / 65536 / 1000,
                  (double)temp[1] / 65536 / 1000,
                  (double)temp[2] / 65536 / 1000,
                  (double)temp[3] / 65536 / 1000,
                  (double)temp[4] / 65536 / 1000,
                  (double)temp[5] / 65536 / 1000 ));

      temp_scale = FT_ABS( temp[3] );

      if ( temp_scale == 0 )
      {
        FT_ERROR(( "cid_parse_font_matrix: invalid font matrix\n" ));
        goto Exit;
      }

      /* atypical case */
      if ( temp_scale != 0x10000L )
      {
        /* set units per EM based on FontMatrix values */
        root->units_per_EM = (FT_UShort)FT_DivFix( 1000, temp_scale );

        temp[0] = FT_DivFix( temp[0], temp_scale );
        temp[1] = FT_DivFix( temp[1], temp_scale );
        temp[2] = FT_DivFix( temp[2], temp_scale );
        temp[4] = FT_DivFix( temp[4], temp_scale );
        temp[5] = FT_DivFix( temp[5], temp_scale );
        temp[3] = temp[3] < 0 ? -0x10000L : 0x10000L;
      }

      matrix->xx = temp[0];
      matrix->yx = temp[1];
      matrix->xy = temp[2];
      matrix->yy = temp[3];

      if ( !FT_Matrix_Check( matrix ) )
      {
        FT_ERROR(( "t1_parse_font_matrix: invalid font matrix\n" ));
        parser->root.error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      /* note that the font offsets are expressed in integer font units */
      offset->x  = temp[4] >> 16;
      offset->y  = temp[5] >> 16;
    }

  Exit:
    return;
  }